

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

string * __thiscall
Assimp::FBX::ParseTokenAsString_abi_cxx11_(string *__return_storage_ptr__,FBX *this,Token *t)

{
  char **in_RCX;
  allocator local_69;
  string local_68;
  string local_48;
  string *local_28;
  string *i;
  char *err;
  Token *t_local;
  
  err = (char *)this;
  t_local = (Token *)__return_storage_ptr__;
  ParseTokenAsString_abi_cxx11_(&local_48,this,(Token *)&i,in_RCX);
  local_28 = &local_48;
  if (i != (string *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,(char *)i,&local_69);
    anon_unknown.dwarf_1924db::ParseError(&local_68,(Token *)err);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string ParseTokenAsString(const Token& t)
{
    const char* err;
    const std::string& i = ParseTokenAsString(t,err);
    if(err) {
        ParseError(err,t);
    }
    return i;
}